

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSwap
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  uint32_t *__a;
  uint32_t *__b;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  GeneratedCodeInfo_Annotation *other_local;
  GeneratedCodeInfo_Annotation *this_local;
  
  rhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  lhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)other);
  internal::InternalMetadata::InternalSwap
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(other->super_Message).super_MessageLite._internal_metadata_);
  __a = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  __b = internal::HasBits<1UL>::operator[](&other->_has_bits_,0);
  std::swap<unsigned_int>(__a,__b);
  RepeatedField<int>::InternalSwap(&this->path_,&other->path_);
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::InternalSwap
            (default_value,&this->source_file_,rhs_arena_00,&other->source_file_,lhs_arena_00);
  internal::memswap<8>((char *)&this->begin_,(char *)&other->begin_);
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::InternalSwap(GeneratedCodeInfo_Annotation* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &source_file_, lhs_arena,
      &other->source_file_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(GeneratedCodeInfo_Annotation, end_)
      + sizeof(GeneratedCodeInfo_Annotation::end_)
      - PROTOBUF_FIELD_OFFSET(GeneratedCodeInfo_Annotation, begin_)>(
          reinterpret_cast<char*>(&begin_),
          reinterpret_cast<char*>(&other->begin_));
}